

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_connect(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  Curl_conncontrol(conn,0);
  conn_local._4_4_ = Curl_proxy_connect(conn,0);
  if (conn_local._4_4_ == CURLE_OK) {
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (((conn->bits).proxy_ssl_connected[0] & 1U) == 0)) {
      conn_local._4_4_ = CURLE_OK;
    }
    else if (conn->tunnel_state[0] == TUNNEL_CONNECT) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      if ((conn->given->flags & 1) == 0) {
        *done = true;
      }
      else {
        CVar1 = https_connecting(conn,done);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
      }
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_connect(struct connectdata *conn, bool *done)
{
  CURLcode result;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(conn, FIRSTSOCKET);
  if(result)
    return result;

  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return CURLE_OK; /* wait for HTTPS proxy SSL initialization to complete */

  if(conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

  if(conn->given->flags & PROTOPT_SSL) {
    /* perform SSL initialization */
    result = https_connecting(conn, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}